

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

BindTargetListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BindTargetListSyntax,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>const&>
          (BumpAllocator *this,Token *args,SeparatedSyntaxList<slang::syntax::NameSyntax> *args_1)

{
  Token colon;
  BindTargetListSyntax *this_00;
  
  this_00 = (BindTargetListSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BindTargetListSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (BindTargetListSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  colon.kind = args->kind;
  colon._2_1_ = args->field_0x2;
  colon.numFlags.raw = (args->numFlags).raw;
  colon.rawLen = args->rawLen;
  colon.info = args->info;
  slang::syntax::BindTargetListSyntax::BindTargetListSyntax(this_00,colon,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }